

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys.cpp
# Opt level: O0

optional<jbcoin::ValidatorToken> * __thiscall
jbcoin::ValidatorKeys::createValidatorToken
          (optional<jbcoin::ValidatorToken> *__return_storage_ptr__,ValidatorKeys *this,
          KeyType *keyType)

{
  Serializer *this_00;
  KeyType type;
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  ValidatorToken local_190;
  allocator local_149;
  undefined1 local_148 [8];
  string m;
  Serializer s;
  ValueProxy<jbcoin::STBlob> local_f8;
  ValueProxy<jbcoin::STInteger<unsigned_int>_> local_e0;
  undefined1 local_c8 [8];
  STObject st;
  PublicKey tokenPublic;
  Seed local_51;
  undefined1 auStack_41 [8];
  SecretKey tokenSecret;
  KeyType *keyType_local;
  ValidatorKeys *this_local;
  
  unique0x10000539 = keyType;
  bVar1 = revoked(this);
  if ((!bVar1) &&
     (uVar2 = std::numeric_limits<unsigned_int>::max(), this->tokenSequence_ < uVar2 - 1)) {
    this->tokenSequence_ = this->tokenSequence_ + 1;
    type = *stack0xffffffffffffffe0;
    randomSeed();
    generateSecretKey((SecretKey *)auStack_41,type,&local_51);
    Seed::~Seed(&local_51);
    derivePublicKey((PublicKey *)&st.mType,*stack0xffffffffffffffe0,(SecretKey *)auStack_41);
    STObject::STObject((STObject *)local_c8,(SField *)sfGeneric);
    STObject::operator[]<jbcoin::STInteger<unsigned_int>>
              (&local_e0,(STObject *)local_c8,
               (TypedField<jbcoin::STInteger<unsigned_int>_> *)sfSequence);
    STObject::ValueProxy<jbcoin::STInteger<unsigned_int>>::operator=
              ((ValueProxy<jbcoin::STInteger<unsigned_int>> *)&local_e0,&this->tokenSequence_);
    STObject::operator[]<jbcoin::STBlob>
              (&local_f8,(STObject *)local_c8,(TypedField<jbcoin::STBlob> *)sfPublicKey);
    STObject::ValueProxy<jbcoin::STBlob>::operator=(&local_f8,&this->publicKey_);
    STObject::operator[]<jbcoin::STBlob>
              ((ValueProxy<jbcoin::STBlob> *)
               &s.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(STObject *)local_c8,
               (TypedField<jbcoin::STBlob> *)sfSigningPubKey);
    STObject::ValueProxy<jbcoin::STBlob>::operator=
              ((ValueProxy<jbcoin::STBlob> *)
               &s.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(PublicKey *)&st.mType);
    jbcoin::sign((EVP_PKEY_CTX *)local_c8,(uchar *)&HashPrefix::manifest,
                 (size_t *)(ulong)(uint)*stack0xffffffffffffffe0,auStack_41,0x526148);
    jbcoin::sign((EVP_PKEY_CTX *)local_c8,(uchar *)&HashPrefix::manifest,
                 (size_t *)(ulong)(uint)this->keyType_,(this->secretKey_).buf_,0x526508);
    Serializer::Serializer((Serializer *)((long)&m.field_2 + 8),0x100);
    STObject::add((STObject *)local_c8,(Serializer *)((long)&m.field_2 + 8));
    this_00 = (Serializer *)((long)&m.field_2 + 8);
    pcVar3 = (char *)Serializer::data(this_00);
    sVar4 = Serializer::size(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_148,pcVar3,sVar4,&local_149);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    beast::detail::base64_encode(&local_190.manifest,(string *)local_148);
    local_190.secretKey.buf_[0x10] = tokenSecret.buf_[8];
    local_190.secretKey.buf_[0x11] = tokenSecret.buf_[9];
    local_190.secretKey.buf_[0x12] = tokenSecret.buf_[10];
    local_190.secretKey.buf_[0x13] = tokenSecret.buf_[0xb];
    local_190.secretKey.buf_[0x14] = tokenSecret.buf_[0xc];
    local_190.secretKey.buf_[0x15] = tokenSecret.buf_[0xd];
    local_190.secretKey.buf_[0x16] = tokenSecret.buf_[0xe];
    local_190.secretKey.buf_[0x17] = tokenSecret.buf_[0xf];
    local_190.secretKey.buf_[0x18] = tokenSecret.buf_[0x10];
    local_190.secretKey.buf_[0x19] = tokenSecret.buf_[0x11];
    local_190.secretKey.buf_[0x1a] = tokenSecret.buf_[0x12];
    local_190.secretKey.buf_[0x1b] = tokenSecret.buf_[0x13];
    local_190.secretKey.buf_[0x1c] = tokenSecret.buf_[0x14];
    local_190.secretKey.buf_[0x1d] = tokenSecret.buf_[0x15];
    local_190.secretKey.buf_[0x1e] = tokenSecret.buf_[0x16];
    local_190.secretKey.buf_[0x1f] = tokenSecret.buf_[0x17];
    local_190.secretKey.buf_[0] = auStack_41[0];
    local_190.secretKey.buf_[1] = auStack_41[1];
    local_190.secretKey.buf_[2] = auStack_41[2];
    local_190.secretKey.buf_[3] = auStack_41[3];
    local_190.secretKey.buf_[4] = auStack_41[4];
    local_190.secretKey.buf_[5] = auStack_41[5];
    local_190.secretKey.buf_[6] = auStack_41[6];
    local_190.secretKey.buf_[7] = auStack_41[7];
    local_190.secretKey.buf_[8] = tokenSecret.buf_[0];
    local_190.secretKey.buf_[9] = tokenSecret.buf_[1];
    local_190.secretKey.buf_[10] = tokenSecret.buf_[2];
    local_190.secretKey.buf_[0xb] = tokenSecret.buf_[3];
    local_190.secretKey.buf_[0xc] = tokenSecret.buf_[4];
    local_190.secretKey.buf_[0xd] = tokenSecret.buf_[5];
    local_190.secretKey.buf_[0xe] = tokenSecret.buf_[6];
    local_190.secretKey.buf_[0xf] = tokenSecret.buf_[7];
    boost::optional<jbcoin::ValidatorToken>::optional(__return_storage_ptr__,&local_190);
    ValidatorToken::~ValidatorToken(&local_190);
    std::__cxx11::string::~string((string *)local_148);
    Serializer::~Serializer((Serializer *)((long)&m.field_2 + 8));
    STObject::~STObject((STObject *)local_c8);
    SecretKey::~SecretKey((SecretKey *)auStack_41);
    return __return_storage_ptr__;
  }
  boost::optional<jbcoin::ValidatorToken>::optional(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

boost::optional<ValidatorToken>
ValidatorKeys::createValidatorToken (
    KeyType const& keyType)
{
    if (revoked () ||
            std::numeric_limits<std::uint32_t>::max () - 1 <= tokenSequence_)
        return boost::none;

    ++tokenSequence_;

    auto const tokenSecret = generateSecretKey (keyType, randomSeed ());
    auto const tokenPublic = derivePublicKey(keyType, tokenSecret);

    STObject st(sfGeneric);
    st[sfSequence] = tokenSequence_;
    st[sfPublicKey] = publicKey_;
    st[sfSigningPubKey] = tokenPublic;

    jbcoin::sign(st, HashPrefix::manifest, keyType, tokenSecret);

    jbcoin::sign(st, HashPrefix::manifest, keyType_, secretKey_,
        sfMasterSignature);

    Serializer s;
    st.add(s);

    std::string m (static_cast<char const*> (s.data()), s.size());
    return ValidatorToken {
        beast::detail::base64_encode(m), tokenSecret };
}